

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask31_16(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  
  auVar1 = *(undefined1 (*) [16])(in + 5);
  uVar2 = in[0xf];
  auVar8 = vpsrlvd_avx2(*(undefined1 (*) [16])(in + 1),_DAT_001979f0);
  auVar5 = vpsllvd_avx2(*(undefined1 (*) [32])(in + 1),_DAT_00195320);
  auVar4 = vpshufd_avx(auVar1,0xe9);
  auVar4 = vpsrlvd_avx2(auVar4,_DAT_00197a00);
  auVar6 = valignd_avx512vl(ZEXT1632(auVar8),ZEXT1632(auVar8),7);
  auVar6 = vpblendd_avx2(auVar6,ZEXT432(*in),1);
  auVar7 = vpbroadcastd_avx512vl();
  uVar3 = *(ulong *)(in + 0xd);
  auVar6 = vpblendd_avx2(auVar6,auVar7,0x20);
  auVar7._0_8_ = auVar4._0_8_;
  auVar7._8_8_ = auVar7._0_8_;
  auVar7._16_8_ = auVar7._0_8_;
  auVar7._24_8_ = auVar7._0_8_;
  auVar6 = vpblendd_avx2(auVar6,auVar7,0xc0);
  auVar6 = vpor_avx2(auVar5,auVar6);
  *(undefined1 (*) [32])out = auVar6;
  auVar4 = *(undefined1 (*) [16])(in + 9);
  auVar8 = vpsllvd_avx2(auVar4,_DAT_001a3e00);
  auVar1 = vpalignr_avx(auVar4,auVar1,0xc);
  auVar1 = vpsrlvd_avx2(auVar1,_DAT_001a3df0);
  auVar1 = vpor_avx(auVar8,auVar1);
  *(undefined1 (*) [16])(out + 8) = auVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar3;
  auVar1 = vpalignr_avx(auVar8,auVar4,0xc);
  auVar4 = vpsrlvd_avx2(auVar1,_DAT_00198800);
  auVar1 = vpsllvd_avx2(auVar8,_DAT_001a3e10);
  auVar1 = vpor_avx(auVar1,auVar4);
  *(long *)(out + 0xc) = auVar1._0_8_;
  out[0xe] = uVar2 << 0x11 | (uint)(uVar3 >> 0x2e);
  out[0xf] = uVar2 >> 0xf;
  return out + 0x10;
}

Assistant:

uint32_t *__fastpackwithoutmask31_16(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (31 - 30);
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (31 - 29);
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (31 - 28);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (31 - 27);
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (31 - 26);
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (31 - 25);
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (31 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (31 - 23);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (31 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (31 - 21);
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (31 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (31 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (31 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (31 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (31 - 16);
  ++in;

  return out + 1;
}